

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O0

bool __thiscall cmDependsFortran::LocateModules(cmDependsFortran *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  bool bVar1;
  byte bVar2;
  pointer pcVar3;
  reference ppVar4;
  iterator __first;
  iterator __last;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  reference __k;
  cmMakefile *this_01;
  string *psVar5;
  reference filename;
  char *pcVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3d0;
  string local_398;
  undefined1 local_378 [8];
  ifstream fin;
  undefined1 local_170 [8];
  string fname;
  string targetDir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i;
  iterator __end1_1;
  iterator __begin1_1;
  cmList *__range1_1;
  allocator<char> local_f9;
  string local_f8;
  cmValue local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  iterator local_a8;
  size_type local_a0;
  undefined1 local_98 [8];
  cmList infoFiles;
  cmMakefile *mf;
  string *r;
  iterator __end2;
  iterator __begin2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  cmFortranSourceInfo *info;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>
  *infoI;
  const_iterator __end1;
  const_iterator __begin1;
  ObjectInfoMap *__range1;
  ObjectInfoMap *objInfo;
  cmDependsFortran *this_local;
  
  pcVar3 = std::
           unique_ptr<cmDependsFortranInternals,_std::default_delete<cmDependsFortranInternals>_>::
           operator->(&this->Internal);
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>_>_>
           ::begin(&pcVar3->ObjectInfo);
  infoI = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>
           *)std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>_>_>
             ::end(&pcVar3->ObjectInfo);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&infoI);
    if (!bVar1) break;
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>_>
             ::operator*(&__end1);
    pcVar3 = std::
             unique_ptr<cmDependsFortranInternals,_std::default_delete<cmDependsFortranInternals>_>
             ::operator->(&this->Internal);
    __first = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin(&(ppVar4->second).Provides);
    __last = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&(ppVar4->second).Provides);
    std::
    set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::
    insert<std::_Rb_tree_const_iterator<std::__cxx11::string>>
              ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)pcVar3,
               (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )__first._M_node,
               (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )__last._M_node);
    this_00 = &(ppVar4->second).Requires;
    __end2 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(this_00);
    r = (string *)
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(this_00);
    while( true ) {
      bVar1 = std::operator!=(&__end2,(_Self *)&r);
      if (!bVar1) break;
      __k = std::
            _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator*(&__end2);
      pcVar3 = std::
               unique_ptr<cmDependsFortranInternals,_std::default_delete<cmDependsFortranInternals>_>
               ::operator->(&this->Internal);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[](&pcVar3->TargetRequires,__k);
      std::__cxx11::string::clear();
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2);
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>_>
    ::operator++(&__end1);
  }
  pcVar3 = std::
           unique_ptr<cmDependsFortranInternals,_std::default_delete<cmDependsFortranInternals>_>::
           operator->(&this->Internal);
  bVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty(&pcVar3->TargetRequires);
  if (bVar1) {
    this_local._7_1_ = 1;
  }
  else {
    MatchLocalModules(this);
    this_01 = cmLocalGenerator::GetMakefile
                        ((cmLocalGenerator *)(this->super_cmDepends).LocalGenerator);
    local_d0 = &local_c8;
    infoFiles.Values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this_01;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"CMAKE_Fortran_TARGET_LINKED_INFO_FILES",&local_f9);
    local_d8 = cmMakefile::GetDefinition(this_01,&local_f8);
    psVar5 = cmValue::operator_cast_to_string_(&local_d8);
    std::__cxx11::string::string((string *)&local_c8,(string *)psVar5);
    local_a8 = &local_c8;
    local_a0 = 1;
    init._M_len = 1;
    init._M_array = local_a8;
    cmList::cmList((cmList *)local_98,init);
    local_3d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a8;
    do {
      local_3d0 = local_3d0 + -1;
      std::__cxx11::string::~string((string *)local_3d0);
    } while (local_3d0 != &local_c8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator(&local_f9);
    __end1_1 = cmList::begin_abi_cxx11_((cmList *)local_98);
    i = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        cmList::end_abi_cxx11_((cmList *)local_98);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1_1,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&i);
      if (!bVar1) break;
      filename = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end1_1);
      cmsys::SystemTools::GetFilenamePath((string *)((long)&fname.field_2 + 8),filename);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&fname.field_2 + 8),"/fortran.internal");
      pcVar6 = (char *)std::__cxx11::string::c_str();
      std::ifstream::ifstream(local_378,pcVar6,_S_in);
      bVar2 = std::ios::operator!((ios *)(local_378 + (long)*(_func_int **)((long)local_378 + -0x18)
                                         ));
      bVar1 = (bVar2 & 1) != 0;
      if (bVar1) {
        cmStrCat<char_const(&)[33],std::__cxx11::string&,char_const(&)[24]>
                  (&local_398,(char (*) [33])"-E cmake_depends failed to open ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170,
                   (char (*) [24])" for module information");
        cmSystemTools::Error(&local_398);
        std::__cxx11::string::~string((string *)&local_398);
        this_local._7_1_ = 0;
      }
      else {
        MatchRemoteModules(this,(istream *)local_378,(string *)((long)&fname.field_2 + 8));
      }
      std::ifstream::~ifstream(local_378);
      std::__cxx11::string::~string((string *)local_170);
      std::__cxx11::string::~string((string *)(fname.field_2._M_local_buf + 8));
      if (bVar1) goto LAB_00b63af6;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1_1);
    }
    this_local._7_1_ = 1;
LAB_00b63af6:
    cmList::~cmList((cmList *)local_98);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmDependsFortran::LocateModules()
{
  // Collect the set of modules provided and required by all sources.
  using ObjectInfoMap = cmDependsFortranInternals::ObjectInfoMap;
  ObjectInfoMap const& objInfo = this->Internal->ObjectInfo;
  for (auto const& infoI : objInfo) {
    cmFortranSourceInfo const& info = infoI.second;
    // Include this module in the set provided by this target.
    this->Internal->TargetProvides.insert(info.Provides.begin(),
                                          info.Provides.end());

    for (std::string const& r : info.Requires) {
      this->Internal->TargetRequires[r].clear();
    }
  }

  // Short-circuit for simple targets.
  if (this->Internal->TargetRequires.empty()) {
    return true;
  }

  // Match modules provided by this target to those it requires.
  this->MatchLocalModules();

  // Load information about other targets.
  cmMakefile* mf = this->LocalGenerator->GetMakefile();
  cmList infoFiles{ mf->GetDefinition(
    "CMAKE_Fortran_TARGET_LINKED_INFO_FILES") };
  for (auto const& i : infoFiles) {
    std::string targetDir = cmSystemTools::GetFilenamePath(i);
    std::string fname = targetDir + "/fortran.internal";
    cmsys::ifstream fin(fname.c_str());
    if (!fin) {
      cmSystemTools::Error(cmStrCat("-E cmake_depends failed to open ", fname,
                                    " for module information"));
      return false;
    }
    this->MatchRemoteModules(fin, targetDir);
  }

  // TODO: Use `CMAKE_Fortran_TARGET_FORWARD_LINKED_INFO_FILES` to handle cases
  // described in #25425. Note that because Makefiles generators do not
  // implement relaxed object compilation as described in #15555, the issues
  // never actually cause build failures; only incremental build incorrectness.

  return true;
}